

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int replace_pattr(attr_list list,atom_t attr_id,attr_value_type val_type,attr_union value)

{
  long lVar1;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  short *in_RDI;
  undefined8 in_R8;
  int index;
  int local_2c;
  undefined4 local_18;
  
  local_2c = 0;
  if (*in_RDI != 0) {
    __assert_fail("list->list_of_lists == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                  ,0x301,"int replace_pattr(attr_list, atom_t, attr_value_type, attr_union)");
  }
  if (in_EDX == 1) {
    for (; local_2c < (int)(uint)*(byte *)(*(long *)(in_RDI + 8) + 1); local_2c = local_2c + 1) {
      if (*(int *)(*(long *)(in_RDI + 8) + 4 + (long)local_2c * 8) == in_ESI) {
        local_18 = (undefined4)in_RCX;
        *(undefined4 *)(*(long *)(in_RDI + 8) + 8 + (long)local_2c * 8) = local_18;
        return 1;
      }
    }
  }
  else {
    for (; local_2c < (int)(uint)*(byte *)(*(long *)(in_RDI + 8) + 2); local_2c = local_2c + 1) {
      if (*(int *)(*(long *)(in_RDI + 4) + (long)local_2c * 0x18) == in_ESI) {
        *(int *)(*(long *)(in_RDI + 4) + (long)local_2c * 0x18 + 4) = in_EDX;
        lVar1 = *(long *)(in_RDI + 4) + (long)local_2c * 0x18;
        *(undefined8 *)(lVar1 + 8) = in_RCX;
        *(undefined8 *)(lVar1 + 0x10) = in_R8;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

extern int
replace_pattr(attr_list list, atom_t attr_id, attr_value_type val_type, attr_union value)
{
    int index = 0;
    assert(list->list_of_lists == 0);
    if (val_type == Attr_Int4) {
	while (index < list->l.list.iattrs->int_attr_count) {
	    if (list->l.list.iattrs->iattr[index].attr_id == attr_id) {
		list->l.list.iattrs->iattr[index].value = (int4)(long)value.u.i;
		return 1;
	    }
	    index++;
	}
    } else {
	while (index < list->l.list.iattrs->other_attr_count) {
	    if (list->l.list.attributes[index].attr_id == attr_id) {
		list->l.list.attributes[index].val_type = val_type;
		list->l.list.attributes[index].value = value;
		return 1;
	    }
	    index++;
	}
    }
    return 0;  
}